

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O1

void weather_update(void)

{
  ushort uVar1;
  AREA_DATA *pAVar2;
  AREA_DATA_conflict *pAVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  size_t __n;
  char *__src;
  int iVar8;
  uint uVar9;
  uint uVar10;
  AREA_DATA_conflict *pAVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  char buf [4608];
  undefined8 local_1238;
  char acStack_1230 [16];
  undefined6 uStack_1220;
  undefined1 uStack_121a;
  undefined1 uStack_1219;
  undefined2 local_1218;
  undefined2 uStack_1216;
  undefined2 uStack_1214;
  undefined1 uStack_1212;
  undefined1 uStack_1211;
  undefined6 uStack_1210;
  undefined1 uStack_120a;
  undefined1 uStack_1209;
  undefined2 uStack_1208;
  undefined4 uStack_1206;
  
  pAVar3 = area_first;
  if (area_first != (AREA_DATA_conflict *)0x0) {
    lVar5 = (long)time_info.season;
    pAVar11 = area_first;
    do {
      iVar4 = number_percent();
      lVar7 = 0;
      do {
        if (iVar4 <= *(short *)((long)pAVar11->climate * 0x78 + lVar5 * 0x12 + 0x4998ca + lVar7 * 2)
           ) {
          pAVar11->sky = (short)lVar7;
          break;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 9);
      iVar4 = number_percent();
      lVar7 = 0;
      do {
        if (iVar4 <= *(short *)((long)pAVar11->climate * 0x78 + lVar5 * 8 + 0x499912 + lVar7 * 2)) {
          pAVar11->temp = (short)lVar7;
          break;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      iVar4 = number_range(0,2);
      pAVar11->wind = (short)iVar4;
      pAVar11 = pAVar11->next;
      pAVar3 = area_first;
    } while (pAVar11 != (AREA_DATA_conflict *)0x0);
  }
  for (; pAVar11 = area_first, pAVar3 != (AREA_DATA_conflict *)0x0; pAVar3 = pAVar3->next) {
    lVar5 = 0;
    iVar6 = 0;
    iVar4 = 0;
    do {
      pAVar2 = pAVar3->adjacent[lVar5];
      if (pAVar2 == (AREA_DATA *)0x0) goto LAB_002c6956;
      iVar4 = iVar4 + pAVar2->sky;
      iVar6 = iVar6 + pAVar2->temp;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x19);
    lVar5 = 0x19;
LAB_002c6956:
    if ((int)lVar5 != 0) {
      iVar8 = (int)lVar5 + 1;
      iVar4 = iVar4 / iVar8;
      uVar9 = iVar4 - pAVar3->sky;
      uVar10 = -uVar9;
      if (0 < (int)uVar9) {
        uVar10 = uVar9;
      }
      if (3 < uVar10) {
        iVar4 = iVar4 + pAVar3->sky;
        pAVar3->sky = (short)((uint)(iVar4 - (iVar4 >> 0x1f)) >> 1);
      }
      iVar6 = iVar6 / iVar8;
      uVar9 = iVar6 - pAVar3->temp;
      uVar10 = -uVar9;
      if (0 < (int)uVar9) {
        uVar10 = uVar9;
      }
      if (1 < uVar10) {
        iVar6 = iVar6 + pAVar3->sky;
        pAVar3->temp = (short)((uint)(iVar6 - (iVar6 >> 0x1f)) >> 1);
      }
    }
    uVar1 = pAVar3->sky;
    if ((5 < (short)uVar1) && (pAVar3->temp < 2)) {
      pAVar3->temp = 2;
    }
    if ((uVar1 < 8) && ((0xb0U >> (uVar1 & 0x1f) & 1) != 0)) {
      pAVar3->wind = pAVar3->wind + 1;
    }
    if (pAVar3->climate == 0) {
      pAVar3->sky = 1;
      pAVar3->temp = 1;
      pAVar3->wind = 0;
    }
  }
  do {
    if (pAVar11 == (AREA_DATA_conflict *)0x0) {
      return;
    }
    switch(pAVar11->sky) {
    case 0:
      local_1218 = 0x6e69;
      uStack_1216 = 0x7420;
      uStack_1214 = 0x6568;
      uStack_1212 = 0x20;
      uStack_1211 = 0x73;
      uStack_1210 = 0x6f626120796b;
      uStack_120a = 0x76;
      uStack_1209 = 0x65;
      builtin_strncpy(acStack_1230 + 8,"loud to ",8);
      uStack_1220 = 0x656573206562;
      uStack_121a = 0x6e;
      uStack_1219 = 0x20;
      local_1238._0_1_ = 'T';
      local_1238._1_1_ = 'h';
      local_1238._2_1_ = 'e';
      local_1238._3_1_ = 'r';
      local_1238._4_1_ = 'e';
      local_1238._5_1_ = ' ';
      local_1238._6_1_ = 'i';
      local_1238._7_1_ = 's';
      builtin_strncpy(acStack_1230," not a c",8);
      uStack_1208 = 0x2e;
      break;
    case 1:
      builtin_strncpy(acStack_1230 + 8," the ski",8);
      uStack_1220 = 0x6f6261207365;
      uStack_121a = 0x76;
      uStack_1219 = 0x65;
      local_1238._0_1_ = 'A';
      local_1238._1_1_ = ' ';
      local_1238._2_1_ = 'f';
      local_1238._3_1_ = 'e';
      local_1238._4_1_ = 'w';
      local_1238._5_1_ = ' ';
      local_1238._6_1_ = 'c';
      local_1238._7_1_ = 'l';
      builtin_strncpy(acStack_1230,"ouds dot",8);
      local_1218 = 0x2e;
      break;
    case 2:
      local_1218 = 0x7275;
      uStack_1216 = 0x7365;
      uStack_1214 = 0x7420;
      uStack_1212 = 0x68;
      uStack_1211 = 0x65;
      uStack_1210 = 0x2e796b7320;
      builtin_strncpy(acStack_1230 + 8,"s of clo",8);
      uStack_1220 = 0x626f20736475;
      uStack_121a = 0x73;
      uStack_1219 = 99;
      uVar12._0_1_ = 'A';
      uVar12._1_1_ = ' ';
      uVar12._2_1_ = 't';
      uVar12._3_1_ = 'h';
      uVar13._0_1_ = 'i';
      uVar13._1_1_ = 'c';
      uVar13._2_1_ = 'k';
      uVar13._3_1_ = ' ';
      uVar14._0_1_ = 'g';
      uVar14._1_1_ = 'r';
      uVar14._2_1_ = 'e';
      uVar14._3_1_ = 'y';
      uVar15._0_1_ = ' ';
      uVar15._1_1_ = 'm';
      uVar15._2_1_ = 'a';
      uVar15._3_1_ = 's';
      goto LAB_002c6adc;
    case 3:
      builtin_strncpy(acStack_1230 + 8,"falls fr",8);
      uStack_1220 = 0x656874206d6f;
      uStack_121a = 0x20;
      uStack_1219 = 0x73;
      local_1238._0_1_ = 'A';
      local_1238._1_1_ = ' ';
      local_1238._2_1_ = 'l';
      local_1238._3_1_ = 'i';
      local_1238._4_1_ = 'g';
      local_1238._5_1_ = 'h';
      local_1238._6_1_ = 't';
      local_1238._7_1_ = ' ';
      builtin_strncpy(acStack_1230,"drizzle ",8);
      local_1218 = 0x796b;
      uStack_1216 = 0x2e;
      break;
    case 4:
      local_1218 = 0x2065;
      uStack_1216 = 0x6b73;
      uStack_1214 = 0x6569;
      uStack_1212 = 0x73;
      uStack_1211 = 0x20;
      uStack_1210 = 0x2e65766f6261;
      uStack_120a = 0;
      builtin_strncpy(acStack_1230 + 8,"our down",8);
      uStack_1220 = 0x206d6f726620;
      uStack_121a = 0x74;
      uStack_1219 = 0x68;
      uVar12._0_1_ = 'S';
      uVar12._1_1_ = 'h';
      uVar12._2_1_ = 'e';
      uVar12._3_1_ = 'e';
      uVar13._0_1_ = 't';
      uVar13._1_1_ = 's';
      uVar13._2_1_ = ' ';
      uVar13._3_1_ = 'o';
      uVar14._0_1_ = 'f';
      uVar14._1_1_ = ' ';
      uVar14._2_1_ = 'r';
      uVar14._3_1_ = 'a';
      uVar15._0_1_ = 'i';
      uVar15._1_1_ = 'n';
      uVar15._2_1_ = ' ';
      uVar15._3_1_ = 'p';
LAB_002c6adc:
      local_1238 = CONCAT44(uVar13,uVar12);
      acStack_1230[4] = (char)uVar15;
      acStack_1230[5] = SUB41(uVar15,1);
      acStack_1230[6] = SUB41(uVar15,2);
      acStack_1230[7] = SUB41(uVar15,3);
      acStack_1230[0] = (char)uVar14;
      acStack_1230[1] = SUB41(uVar14,1);
      acStack_1230[2] = SUB41(uVar14,2);
      acStack_1230[3] = SUB41(uVar14,3);
      break;
    case 5:
      __n = 0x4b;
      __src = "Lightning flashes in the distance as a booming peal of thunder approaches.";
      goto LAB_002c6b45;
    case 6:
      local_1218 = 0x7266;
      uStack_1216 = 0x6d6f;
      uStack_1214 = 0x7420;
      uStack_1212 = 0x68;
      uStack_1211 = 0x65;
      uStack_1210 = 0x7365696b7320;
      builtin_strncpy(acStack_1230 + 8,"akes dri",8);
      uStack_1220 = 0x776f64207466;
      uStack_121a = 0x6e;
      uStack_1219 = 0x20;
      local_1238._0_1_ = 'S';
      local_1238._1_1_ = 'c';
      local_1238._2_1_ = 'a';
      local_1238._3_1_ = 't';
      local_1238._4_1_ = 't';
      local_1238._5_1_ = 'e';
      local_1238._6_1_ = 'r';
      local_1238._7_1_ = 'e';
      builtin_strncpy(acStack_1230,"d snowfl",8);
      uStack_120a = 0x20;
      uStack_1209 = 0x61;
      uStack_1208 = 0x6f62;
      uStack_1206 = 0x2e6576;
      break;
    case 7:
      __n = 0x42;
      __src = "Driving snow sweeps down from the skies as a chill fills the air.";
LAB_002c6b45:
      memcpy(&local_1238,__src,__n);
      break;
    case 8:
      local_1218 = 0x6620;
      uStack_1216 = 0x6c61;
      uStack_1214 = 0x206c;
      uStack_1212 = 0x66;
      uStack_1211 = 0x72;
      uStack_1210 = 0x656874206d6f;
      builtin_strncpy(acStack_1230 + 8,"lstones ",8);
      uStack_1220 = 0x206e69676562;
      uStack_121a = 0x74;
      uStack_1219 = 0x6f;
      local_1238._0_1_ = 'P';
      local_1238._1_1_ = 'e';
      local_1238._2_1_ = 'b';
      local_1238._3_1_ = 'b';
      local_1238._4_1_ = 'l';
      local_1238._5_1_ = 'e';
      local_1238._6_1_ = '-';
      local_1238._7_1_ = 's';
      builtin_strncpy(acStack_1230,"ized hai",8);
      uStack_120a = 0x20;
      uStack_1209 = 0x73;
      uStack_1208 = 0x696b;
      uStack_1206 = 0x2e7365;
      break;
    default:
      local_1238 = local_1238 & 0xffffffffffffff00;
    }
    outdoors_echo(pAVar11,(char *)&local_1238);
    pAVar11 = pAVar11->next;
  } while( true );
}

Assistant:

void weather_update(void)
{
	char buf[MSL];
	int i, random, season = time_info.season;
	int average = 0, skytot = 0, temptot = 0;
	AREA_DATA *area;

	/* Randomize sky, temperature, wind for each area, based on climate */
	for (area = area_first; area; area = area->next)
	{
		random = number_percent();

		for (i = 0; i < WeatherCondition::MaxWeatherCondition; i++)
		{
			if (random <= climate_table[area->climate].skyfreqs[season][i])
			{
				area->sky = i;
				break;
			}
		}

		random = number_percent();

		for (i = 0; i < Temperature::MaxTemperature; i++)
		{
			if (random <= climate_table[area->climate].tempfreqs[season][i])
			{
				area->temp = i;
				break;
			}
		}

		area->wind = number_range(0, 2);
	}

	/* Adjacent areas have a moderating influence on weather.  If there's
	 * a blizzard going on next door, it won't be perfectly sunny.  Similarly,
	 * it won't be hot and snowing at the same time, etc.  Just make sure that
	 * illogical combinations are eliminated. */
	for (area = area_first; area; area = area->next)
	{
		skytot = 0;
		temptot = 0;

		for (i = 0; i < MAX_ADJACENT; i++)
		{
			if (!area->adjacent[i])
				break;

			skytot += area->adjacent[i]->sky;
			temptot += area->adjacent[i]->temp;
		}

		if (i > 0)
		{
			average = skytot / (i + 1);

			if (abs(average - area->sky) >= 4)
				area->sky = (area->sky + average) / 2;

			average = temptot / (i + 1);

			if (abs(average - area->temp) >= 2)
				area->temp = (area->sky + average) / 2;
		}

		if (area->sky >= WeatherCondition::SnowFlurry && area->temp < Temperature::Cool)
			area->temp = Temperature::Cool;

		if (area->sky == WeatherCondition::Downpour
				 || area->sky == WeatherCondition::ThunderStorm
				 || area->sky == WeatherCondition::Blizzard)
			area->wind++;

		if (area->climate == Climate::None)
		{
			area->sky = WeatherCondition::PartlyCloudy;
			area->temp = Temperature::Warm;
			area->wind = Windspeed::Calm;
		}
	}

	/* Echo the changing weather to everyone who's outdoors. */
	for (area = area_first; area; area = area->next)
	{
		switch (area->sky)
		{
			case WeatherCondition::Clear:
				sprintf(buf, "There is not a cloud to be seen in the sky above.");
				break;
			case WeatherCondition::PartlyCloudy:
				sprintf(buf, "A few clouds dot the skies above.");
				break;
			case WeatherCondition::Overcast:
				sprintf(buf, "A thick grey mass of clouds obscures the sky.");
				break;
			case WeatherCondition::Drizzle:
				sprintf(buf, "A light drizzle falls from the sky.");
				break;
			case WeatherCondition::Downpour:
				sprintf(buf, "Sheets of rain pour down from the skies above.");
				break;
			case WeatherCondition::ThunderStorm:
				sprintf(buf, "Lightning flashes in the distance as a booming peal of thunder approaches.");
				break;
			case WeatherCondition::SnowFlurry:
				sprintf(buf, "Scattered snowflakes drift down from the skies above.");
				break;
			case WeatherCondition::Blizzard:
				sprintf(buf, "Driving snow sweeps down from the skies as a chill fills the air.");
				break;
			case WeatherCondition::Hail:
				sprintf(buf, "Pebble-sized hailstones begin to fall from the skies.");
				break;
			default:
				buf[0] = '\0';
				break;
		}

		outdoors_echo(area, buf);
	}
}